

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.cc
# Opt level: O1

shared_ptr<VW::config::base_option> __thiscall
VW::config::options_boost_po::get_option(options_boost_po *this,string *key)

{
  _Base_ptr p_Var1;
  iterator iVar2;
  out_of_range *this_00;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<VW::config::base_option> sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VW::config::base_option>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VW::config::base_option>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VW::config::base_option>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VW::config::base_option>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VW::config::base_option>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VW::config::base_option>_>_>_>
                  *)&key->_M_string_length,in_RDX);
  if (iVar2._M_node != (_Base_ptr)&key->field_2) {
    (this->super_options_i)._vptr_options_i = *(_func_int ***)(iVar2._M_node + 2);
    p_Var1 = iVar2._M_node[2]._M_parent;
    *(_Base_ptr *)&(this->m_options)._M_t._M_impl = p_Var1;
    if (p_Var1 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
      }
    }
    sVar3.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = extraout_RDX._M_pi;
    sVar3.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<VW::config::base_option>)
           sVar3.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::operator+(&local_40,in_RDX," was not found.");
  std::out_of_range::out_of_range(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

std::shared_ptr<base_option> VW::config::options_boost_po::get_option(const std::string& key)
{
  auto it = m_options.find(key);
  if (it != m_options.end())
  {
    return it->second;
  }

  throw std::out_of_range(key + " was not found.");
}